

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

Ivy_Obj_t * Ivy_ObjReal(Ivy_Obj_t *pObj)

{
  Ivy_Obj_t *pIVar1;
  
  if (pObj == (Ivy_Obj_t *)0x0) {
    pObj = (Ivy_Obj_t *)0x0;
  }
  else if ((*(uint *)(((ulong)pObj & 0xfffffffffffffffe) + 8) & 0xf) == 7) {
    pIVar1 = Ivy_ObjReal(*(Ivy_Obj_t **)(((ulong)pObj & 0xfffffffffffffffe) + 0x10));
    pObj = (Ivy_Obj_t *)((ulong)((uint)pObj & 1) ^ (ulong)pIVar1);
  }
  return pObj;
}

Assistant:

Ivy_Obj_t * Ivy_ObjReal( Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanin;
    if ( pObj == NULL || !Ivy_ObjIsBuf( Ivy_Regular(pObj) ) )
        return pObj;
    pFanin = Ivy_ObjReal( Ivy_ObjChild0(Ivy_Regular(pObj)) );
    return Ivy_NotCond( pFanin, Ivy_IsComplement(pObj) );
}